

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_type_test.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3c48d::FieldTypeTest_TestValueOfCodeReturnsSameFieldType_Test::TestBody
          (FieldTypeTest_TestValueOfCodeReturnsSameFieldType_Test *this)

{
  char *pcVar1;
  AssertHelper local_30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertionResult gtest_ar;
  
  local_28.ptr_._0_1_ = 0x44;
  local_30.data_._0_1_ = bidfx_public_api::price::pixie::FieldTypeMethods::ValueOf(0x44);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::FieldTypeEnum,bidfx_public_api::price::pixie::FieldTypeEnum>
            ((internal *)&gtest_ar,"FieldTypeEnum::DOUBLE",
             "FieldTypeMethods::ValueOf((int) FieldTypeEnum::DOUBLE)",(FieldTypeEnum *)&local_28,
             (FieldTypeEnum *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_type_test.cpp"
               ,0x1b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_28.ptr_._0_1_ = 0x49;
    local_30.data_._0_1_ = bidfx_public_api::price::pixie::FieldTypeMethods::ValueOf(0x49);
    testing::internal::
    CmpHelperEQ<bidfx_public_api::price::pixie::FieldTypeEnum,bidfx_public_api::price::pixie::FieldTypeEnum>
              ((internal *)&gtest_ar,"FieldTypeEnum::INTEGER",
               "FieldTypeMethods::ValueOf((int) FieldTypeEnum::INTEGER)",(FieldTypeEnum *)&local_28,
               (FieldTypeEnum *)&local_30);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_28);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_type_test.cpp"
                 ,0x1c,pcVar1);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_28.ptr_._0_1_ = 0x4c;
      local_30.data_._0_1_ = bidfx_public_api::price::pixie::FieldTypeMethods::ValueOf(0x4c);
      testing::internal::
      CmpHelperEQ<bidfx_public_api::price::pixie::FieldTypeEnum,bidfx_public_api::price::pixie::FieldTypeEnum>
                ((internal *)&gtest_ar,"FieldTypeEnum::LONG",
                 "FieldTypeMethods::ValueOf((int) FieldTypeEnum::LONG)",(FieldTypeEnum *)&local_28,
                 (FieldTypeEnum *)&local_30);
      if (gtest_ar.success_ != false) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_28.ptr_._0_1_ = 0x53;
        local_30.data_._0_1_ = bidfx_public_api::price::pixie::FieldTypeMethods::ValueOf(0x53);
        testing::internal::
        CmpHelperEQ<bidfx_public_api::price::pixie::FieldTypeEnum,bidfx_public_api::price::pixie::FieldTypeEnum>
                  ((internal *)&gtest_ar,"FieldTypeEnum::STRING",
                   "FieldTypeMethods::ValueOf((int) FieldTypeEnum::STRING)",
                   (FieldTypeEnum *)&local_28,(FieldTypeEnum *)&local_30);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_28);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_type_test.cpp"
                     ,0x1e,pcVar1);
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
          testing::internal::AssertHelper::~AssertHelper(&local_30);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_28);
        }
        goto LAB_00166de3;
      }
      testing::Message::Message((Message *)&local_28);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_type_test.cpp"
                 ,0x1d,pcVar1);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_28);
LAB_00166de3:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FieldTypeTest, TestValueOfCodeReturnsSameFieldType)
{
    ASSERT_EQ(FieldTypeEnum::DOUBLE, FieldTypeMethods::ValueOf((int) FieldTypeEnum::DOUBLE));
    ASSERT_EQ(FieldTypeEnum::INTEGER, FieldTypeMethods::ValueOf((int) FieldTypeEnum::INTEGER));
    ASSERT_EQ(FieldTypeEnum::LONG, FieldTypeMethods::ValueOf((int) FieldTypeEnum::LONG));
    ASSERT_EQ(FieldTypeEnum::STRING, FieldTypeMethods::ValueOf((int) FieldTypeEnum::STRING));
}